

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerGLSL::expression_is_constant_null(CompilerGLSL *this,uint32_t id)

{
  Variant *pVVar1;
  bool bVar2;
  SPIRConstant *pSVar3;
  ConstantMatrix *pCVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar5 = (ulong)id;
  if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size <= uVar5) {
    return false;
  }
  pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
  if (pVVar1[uVar5].type == TypeConstant) {
    pSVar3 = Variant::get<spirv_cross::SPIRConstant>(pVVar1 + uVar5);
    bVar2 = false;
    if ((pSVar3->specialization == false) &&
       (bVar2 = false,
       (pSVar3->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.
       buffer_size == 0)) {
      uVar5 = (ulong)(pSVar3->m).columns;
      bVar2 = true;
      if (uVar5 != 0) {
        uVar6 = (ulong)(pSVar3->m).c[0].vecsize;
        pCVar4 = &pSVar3->m;
        uVar7 = 0;
        do {
          if (uVar6 != 0) {
            uVar8 = 0;
            do {
              if (pCVar4->c[0].r[uVar8].u64 != 0) goto LAB_00333d2b;
              uVar8 = uVar8 + 1;
            } while (uVar6 != uVar8);
          }
          uVar7 = uVar7 + 1;
          pCVar4 = (ConstantMatrix *)(pCVar4->c + 1);
        } while (uVar7 != uVar5);
      }
    }
  }
  else {
LAB_00333d2b:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

const T *maybe_get(uint32_t id) const
	{
		if (id >= ir.ids.size())
			return nullptr;
		else if (ir.ids[id].get_type() == static_cast<Types>(T::type))
			return &get<T>(id);
		else
			return nullptr;
	}